

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O2

void __thiscall
WordSplitStringTest_random_long_prefix_two_delim_Test<char8_t>::TestBody
          (WordSplitStringTest_random_long_prefix_two_delim_Test<char8_t> *this)

{
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *__rhs;
  char *pcVar1;
  AssertHelper local_120 [8];
  long *local_118;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  split_result;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> delim;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_b0;
  RandomWordTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  data;
  
  make_delim_long<char8_t,std::__cxx11::u8string>(&delim,8,'\0');
  std::__cxx11::u8string::u8string((u8string *)&local_b0,&delim);
  RandomWordTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::RandomWordTestData(&data,&local_b0,0,0);
  std::__cxx11::u8string::~u8string((u8string *)&local_b0);
  std::operator+((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                 &gtest_ar,&delim,&delim);
  __rhs = &data.m_str;
  std::operator+((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                 &split_result,
                 (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                 &gtest_ar,__rhs);
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  operator=(__rhs,(basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                  &split_result);
  std::__cxx11::u8string::~u8string((u8string *)&split_result);
  std::__cxx11::u8string::~u8string((u8string *)&gtest_ar);
  jessilib::
  word_split<std::vector,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&split_result,__rhs,&delim);
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>,std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
            ((internal *)&gtest_ar,"split_result","data.m_tokens",&split_result,&data.m_tokens);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x117,pcVar1);
    testing::internal::AssertHelper::operator=(local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_120);
    if (local_118 != (long *)0x0) {
      (**(code **)(*local_118 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&split_result);
  RandomWordTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::~RandomWordTestData(&data);
  std::__cxx11::u8string::~u8string((u8string *)&delim);
  return;
}

Assistant:

TYPED_TEST(WordSplitStringTest, random_long_prefix_two_delim) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomWordTestData<TypeParam> data{ delim };
	data.m_str = delim + delim + data.m_str;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}